

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_nls.c
# Opt level: O0

int arkStep_Nls(ARKodeMem ark_mem,int nflag)

{
  bool bVar1;
  undefined4 uVar2;
  int iVar3;
  int in_ESI;
  ARKodeMem in_RDI;
  double dVar4;
  int retval;
  long nls_fails_inc;
  long nls_iters_inc;
  int callLSetup;
  ARKodeARKStepMem step_mem;
  N_Vector in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc1;
  undefined1 in_stack_ffffffffffffffc2;
  undefined1 in_stack_ffffffffffffffc3;
  undefined4 in_stack_ffffffffffffffc4;
  N_Vector x;
  realtype tol;
  undefined4 in_stack_ffffffffffffffd8;
  uint uVar5;
  N_Vector y;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  tol = 0.0;
  x = (N_Vector)0x0;
  if (in_RDI->step_mem == (void *)0x0) {
    arkProcessError(in_RDI,-0x15,"ARKode::ARKStep","arkStep_Nls","Time step module memory is NULL.")
    ;
    local_4 = -0x15;
  }
  else {
    y = (N_Vector)in_RDI->step_mem;
    if (y[0xb].ops == (N_Vector_Ops)0x0) {
      y[8].ops = (N_Vector_Ops)&DAT_3ff0000000000000;
      uVar5 = 0;
    }
    else {
      if (*(int *)&y->sunctx == 0) {
        in_stack_ffffffffffffffc3 = in_ESI == 6 || in_ESI == 8;
        uVar2 = 2;
        if (in_ESI == 6 || in_ESI == 8) {
          uVar2 = 0;
        }
        *(undefined4 *)((long)&y[10].ops + 4) = uVar2;
      }
      else {
        uVar2 = 2;
        if (in_ESI == 6) {
          uVar2 = 0;
        }
        *(undefined4 *)((long)&y[10].ops + 4) = uVar2;
      }
      in_stack_ffffffffffffffc2 = true;
      if ((in_RDI->firststage == 0) && (in_stack_ffffffffffffffc2 = true, -1 < *(int *)&y[9].sunctx)
         ) {
        dVar4 = ABS((double)y[6].sunctx - 1.0);
        in_stack_ffffffffffffffc2 = (double)y[7].content <= dVar4 && dVar4 != (double)y[7].content;
      }
      if (*(int *)&y->sunctx == 0) {
        in_stack_ffffffffffffffc0 = true;
        bVar1 = (bool)in_stack_ffffffffffffffc0;
        if ((((bool)in_stack_ffffffffffffffc2 == false) &&
            (in_stack_ffffffffffffffc0 = true, bVar1 = (bool)in_stack_ffffffffffffffc0, in_ESI != 7)
            ) && (in_stack_ffffffffffffffc0 = true, bVar1 = (bool)in_stack_ffffffffffffffc0,
                 in_ESI != 8)) {
          iVar3 = *(int *)&y[9].sunctx;
          if (iVar3 < 1) {
            iVar3 = -iVar3;
          }
          in_stack_ffffffffffffffc0 = (long)y[10].content + (long)iVar3 <= in_RDI->nst;
          bVar1 = (bool)in_stack_ffffffffffffffc0;
        }
      }
      else {
        in_stack_ffffffffffffffc1 = true;
        bVar1 = (bool)in_stack_ffffffffffffffc1;
        if ((bool)in_stack_ffffffffffffffc2 == false) {
          in_stack_ffffffffffffffc1 = *(int *)((long)&y->sunctx + 4) != 0;
          bVar1 = (bool)in_stack_ffffffffffffffc1;
        }
      }
      uVar5 = (uint)bVar1;
    }
    N_VConst((realtype)
             CONCAT44(in_stack_ffffffffffffffc4,
                      CONCAT13(in_stack_ffffffffffffffc3,
                               CONCAT12(in_stack_ffffffffffffffc2,
                                        CONCAT11(in_stack_ffffffffffffffc1,in_stack_ffffffffffffffc0
                                                )))),in_stack_ffffffffffffffb8);
    y[9].content = (void *)((double)y[9].ops * 0.1);
    local_4 = SUNNonlinSolSolve((SUNNonlinearSolver)in_RDI,
                                (N_Vector)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),y,
                                (N_Vector)CONCAT44(uVar5,in_stack_ffffffffffffffd8),tol,
                                (int)((ulong)x >> 0x20),
                                (void *)CONCAT44(in_stack_ffffffffffffffc4,
                                                 CONCAT13(in_stack_ffffffffffffffc3,
                                                          CONCAT12(in_stack_ffffffffffffffc2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffffc1,
                                                  in_stack_ffffffffffffffc0)))));
    SUNNonlinSolGetNumIters((SUNNonlinearSolver)in_stack_ffffffffffffffb8,(long *)0x117e7d1);
    y[0x10].ops = (N_Vector_Ops)((long)&(y[0x10].ops)->nvgetvectorid + (long)tol);
    SUNNonlinSolGetNumConvFails((SUNNonlinearSolver)in_stack_ffffffffffffffb8,(long *)0x117e7fc);
    y[0x10].sunctx = (SUNContext)((long)&(y[0x10].sunctx)->profiler + (long)&x->content);
    if (local_4 == 0) {
      *(undefined4 *)&y[10].sunctx = 0;
      N_VLinearSum(tol,x,(realtype)
                         (ulong)CONCAT13(in_stack_ffffffffffffffc3,
                                         CONCAT12(in_stack_ffffffffffffffc2,
                                                  CONCAT11(in_stack_ffffffffffffffc1,
                                                           in_stack_ffffffffffffffc0))),
                   in_stack_ffffffffffffffb8,(N_Vector)0x117e858);
      local_4 = 0;
    }
    else if (local_4 == 0x386) {
      local_4 = 4;
    }
  }
  return local_4;
}

Assistant:

int arkStep_Nls(ARKodeMem ark_mem, int nflag)
{
  ARKodeARKStepMem step_mem;
  booleantype callLSetup;
  long int nls_iters_inc = 0;
  long int nls_fails_inc = 0;
  int retval;

  /* access ARKodeARKStepMem structure */
  if (ark_mem->step_mem==NULL) {
    arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::ARKStep",
                    "arkStep_Nls", MSG_ARKSTEP_NO_MEM);
    return(ARK_MEM_NULL);
  }
  step_mem = (ARKodeARKStepMem) ark_mem->step_mem;

  /* If a linear solver 'setup' is supplied, set various flags for
     determining whether it should be called */
  if (step_mem->lsetup) {

    /* Set interface 'convfail' flag for use inside lsetup */
    if (step_mem->linear) {
      step_mem->convfail = (nflag == FIRST_CALL) ? ARK_NO_FAILURES : ARK_FAIL_OTHER;
    } else {
      step_mem->convfail = ((nflag == FIRST_CALL) || (nflag == PREV_ERR_FAIL)) ?
        ARK_NO_FAILURES : ARK_FAIL_OTHER;
    }

    /* Decide whether to recommend call to lsetup within nonlinear solver */
    callLSetup = (ark_mem->firststage) || (step_mem->msbp < 0) ||
      (SUNRabs(step_mem->gamrat-ONE) > step_mem->dgmax);
    if (step_mem->linear) {   /* linearly-implicit problem */
      callLSetup = callLSetup || (step_mem->linear_timedep);
    } else {                  /* nonlinearly-implicit problem */
      callLSetup = callLSetup ||
        (nflag == PREV_CONV_FAIL) || (nflag == PREV_ERR_FAIL) ||
        (ark_mem->nst >= step_mem->nstlp + abs(step_mem->msbp));
    }
  } else {
    step_mem->crate = ONE;
    callLSetup = SUNFALSE;
  }

  /* set a zero guess for correction */
  N_VConst(ZERO, step_mem->zcor);

  /* Reset the stored residual norm (for iterative linear solvers) */
  step_mem->eRNrm = RCONST(0.1) * step_mem->nlscoef;

  /* solve the nonlinear system for the actual correction */
  retval = SUNNonlinSolSolve(step_mem->NLS, step_mem->zpred, step_mem->zcor,
                             ark_mem->ewt, step_mem->nlscoef, callLSetup, ark_mem);

#ifdef SUNDIALS_DEBUG_PRINTVEC
  printf("    ARKStep nonlinear solution zcor:\n");
  N_VPrint(step_mem->zcor);
#endif

  /* increment counters */
  (void) SUNNonlinSolGetNumIters(step_mem->NLS, &nls_iters_inc);
  step_mem->nls_iters += nls_iters_inc;

  (void) SUNNonlinSolGetNumConvFails(step_mem->NLS, &nls_fails_inc);
  step_mem->nls_fails += nls_fails_inc;

  /* successful solve -- reset jcur flag and apply correction */
  if (retval == SUN_NLS_SUCCESS) {
    step_mem->jcur = SUNFALSE;
    N_VLinearSum(ONE, step_mem->zcor, ONE, step_mem->zpred, ark_mem->ycur);
    return(ARK_SUCCESS);
  }

  /* check for recoverable failure, return ARKode::CONV_FAIL */
  if (retval == SUN_NLS_CONV_RECVR) return(CONV_FAIL);

  return(retval);
}